

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_hash.c
# Opt level: O1

ion_status_t oah_delete(ion_hashmap_t *hash_map,ion_key_t key)

{
  ion_err_t iVar1;
  ion_status_t iVar2;
  int loc;
  int local_c;
  
  local_c = -1;
  iVar1 = oah_find_item_loc(hash_map,key,&local_c);
  iVar2.error = '\x01';
  iVar2._1_3_ = 0;
  iVar2.count = 0;
  if (iVar1 != '\x01') {
    hash_map->entry
    [(long)((hash_map->super).record.key_size + (hash_map->super).record.value_size + 1) *
     (long)local_c] = -2;
    iVar2.error = '\0';
    iVar2._1_3_ = 0;
    iVar2.count = 1;
  }
  return iVar2;
}

Assistant:

ion_status_t
oah_delete(
	ion_hashmap_t	*hash_map,
	ion_key_t		key
) {
	int loc = -1;

	if (oah_find_item_loc(hash_map, key, &loc) == err_item_not_found) {
#if ION_DEBUG
		printf("Item not found when trying to oah_delete.\n");
#endif
		return ION_STATUS_ERROR(err_item_not_found);
	}
	else {
		/* locate item */
		ion_hash_bucket_t *item = (((ion_hash_bucket_t *) ((hash_map->entry + (hash_map->super.record.key_size + hash_map->super.record.value_size + SIZEOF(STATUS)) * loc))));

		item->status = ION_DELETED;	/* delete item */

#if ION_DEBUG
		printf("Item deleted at location %d\n", loc);
#endif
		return ION_STATUS_OK(1);
	}
}